

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
::
unchecked_insert<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>const&>
          (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
           *this,pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>
                 *x)

{
  uint64_t hash;
  locator res;
  locator lStack_28;
  
  hash = slang::detail::hashing::hash((x->first)._M_str,(x->first)._M_len);
  nosize_unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>const&>
            (&lStack_28,this,(arrays_type *)this,hash >> ((byte)*this & 0x3f),hash,x);
  *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
  return;
}

Assistant:

void unchecked_insert(Value&& x) {
        auto hash = hash_for(key_from(x));
        unchecked_emplace_at(position_for(hash), hash, std::forward<Value>(x));
    }